

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  ConfigData *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Session_004d27c8;
  cleanUp();
  clara::std::shared_ptr<Catch::Config>::~shared_ptr((shared_ptr<Catch::Config> *)0x310695);
  ConfigData::~ConfigData(in_RDI);
  clara::detail::Parser::~Parser((Parser *)in_RDI);
  NonCopyable::~NonCopyable((NonCopyable *)in_RDI);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }